

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O2

void __thiscall webrtc::SincResampler::UpdateRegions(SincResampler *this,bool second_load)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  pfVar2 = (this->input_buffer_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
           super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000031,second_load) << 6);
  this->r0_ = (float *)((long)pfVar2 + uVar5 + 0x40);
  pfVar4 = (float *)((long)pfVar2 + this->request_frames_ * 4 + uVar5 + -0x40);
  this->r3_ = pfVar4;
  pfVar1 = (float *)((long)pfVar2 + this->request_frames_ * 4 + uVar5);
  this->r4_ = pfVar1;
  pfVar3 = this->r2_;
  this->block_size_ = (long)pfVar1 - (long)pfVar3 >> 2;
  if (this->r1_ != pfVar2) {
    __assert_fail("r1_ == input_buffer_.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                  ,0xc9,"void webrtc::SincResampler::UpdateRegions(bool)");
  }
  if ((long)pfVar3 - (long)pfVar2 == 0x40) {
    if (pfVar3 < pfVar4) {
      return;
    }
    __assert_fail("r2_ < r3_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                  ,0xcd,"void webrtc::SincResampler::UpdateRegions(bool)");
  }
  __assert_fail("r2_ - r1_ == r4_ - r3_",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                ,0xcb,"void webrtc::SincResampler::UpdateRegions(bool)");
}

Assistant:

void SincResampler::UpdateRegions(bool second_load) {
  // Setup various region pointers in the buffer (see diagram above).  If we're
  // on the second load we need to slide r0_ to the right by kKernelSize / 2.
  r0_ = input_buffer_.get() + (second_load ? kKernelSize : kKernelSize / 2);
  r3_ = r0_ + request_frames_ - kKernelSize;
  r4_ = r0_ + request_frames_ - kKernelSize / 2;
  block_size_ = r4_ - r2_;

  // r1_ at the beginning of the buffer.
  assert(r1_ == input_buffer_.get());
  // r1_ left of r2_, r4_ left of r3_ and size correct.
  assert(r2_ - r1_ == r4_ - r3_);
  // r2_ left of r3.
  assert(r2_ < r3_);
}